

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_BracketOperatorCrashing_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BracketOperatorCrashing_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *this_00;
  int iVar1;
  int i;
  int index;
  int iters;
  int local_7c;
  pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_78;
  
  iVar1 = UniqueObjectHelper<int>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0xc) = iVar1;
  iVar1 = 0;
  do {
    index = 0x21;
    do {
      local_7c = UniqueObjectHelper<int>(index);
      UniqueObjectHelper<int>(index);
      google::
      sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
      insert(&local_78,this_00,&local_7c);
      index = index + 1;
    } while (index != 0x85);
    google::
    sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::clear(&this_00->rep);
    local_7c = UniqueObjectHelper<int>(2);
    UniqueObjectHelper<int>(2);
    google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert(&local_78,this_00,&local_7c);
    local_78.first.ht._0_4_ = UniqueObjectHelper<int>(2);
    google::
    sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&this_00->rep,(key_type *)&local_78);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 10);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BracketOperatorCrashing) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int iters = 0; iters < 10; iters++) {
    // We start at 33 because after shrinking, we'll be at 32 buckets.
    for (int i = 33; i < 133; i++) {
      this->ht_.bracket_assign(this->UniqueKey(i),
                               this->ht_.get_data(this->UniqueObject(i)));
    }
    this->ht_.clear_no_resize();
    // This will force a shrink on the next insert, which we want to test.
    this->ht_.bracket_assign(this->UniqueKey(2),
                             this->ht_.get_data(this->UniqueObject(2)));
    this->ht_.erase(this->UniqueKey(2));
  }
}